

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O3

void al_set_new_window_title(char *title)

{
  long *plVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  
  plVar1 = (long *)__tls_get_addr(&PTR_001d9500);
  lVar4 = *plVar1;
  if (lVar4 == 0) {
    *plVar1 = (long)(plVar1 + 1);
    initialize_tls_values((thread_local_state *)(plVar1 + 1));
    lVar4 = *plVar1;
    if (lVar4 == 0) {
      return;
    }
  }
  sVar2 = strlen(title);
  sVar3 = 0xff;
  if (sVar2 < 0xff) {
    sVar3 = sVar2;
  }
  _al_sane_strncpy((char *)(lVar4 + 0x124),title,sVar3 + 1);
  return;
}

Assistant:

void al_set_new_window_title(const char *title)
{
   thread_local_state *tls;
   size_t size;

   if ((tls = tls_get()) == NULL)
      return;

   size = strlen(title);

   if (size > ALLEGRO_NEW_WINDOW_TITLE_MAX_SIZE) {
      size = ALLEGRO_NEW_WINDOW_TITLE_MAX_SIZE;
   }

   _al_sane_strncpy(tls->new_window_title, title, size + 1);
}